

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldMapTests::TestsetMessageOrder::TestsetMessageOrder(TestsetMessageOrder *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"setMessageOrder","FieldMapTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldMapTestCase.cpp"
             ,0x25);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031d090;
  return;
}

Assistant:

TEST(setMessageOrder)
{
  int order[] = {1, 2, 3, 0}; // '0' is used to signify the end of array passed to FieldMap()
  FieldMap fieldMap(order);
  fieldMap.setField(3, "account");
  fieldMap.setField(1, "adv_id");
  fieldMap.setField(2, "adv_ref_id");

  int pos1 = 0, pos2 = 0, pos3 = 0;
  int iterationCount = 0;
  for( FieldMap::iterator itr = fieldMap.begin(); itr != fieldMap.end(); itr++, iterationCount++) {
    if(iterationCount == 0) {
      pos1 = itr->getTag();
    } else if (iterationCount == 1 ) {
      pos2 = itr->getTag();
    } else if (iterationCount == 2) {
      pos3 = itr->getTag();
    }
  }

  CHECK_EQUAL(1, pos1);
  CHECK_EQUAL(2, pos2);
  CHECK_EQUAL(3, pos3);

}